

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void checkProgress(IntegrityCk *pCheck)

{
  sqlite3 *psVar1;
  _func_int_void_ptr *p_Var2;
  uint uVar3;
  int iVar4;
  
  psVar1 = pCheck->db;
  if ((psVar1->u1).isInterrupted != 0) {
    pCheck->rc = 9;
    pCheck->nErr = pCheck->nErr + 1;
    pCheck->mxErr = 0;
  }
  p_Var2 = psVar1->xProgress;
  if (p_Var2 != (_func_int_void_ptr *)0x0) {
    uVar3 = pCheck->nStep + 1;
    pCheck->nStep = uVar3;
    if (uVar3 % psVar1->nProgressOps == 0) {
      iVar4 = (*p_Var2)(psVar1->pProgressArg);
      if (iVar4 != 0) {
        pCheck->rc = 9;
        pCheck->nErr = pCheck->nErr + 1;
        pCheck->mxErr = 0;
      }
    }
  }
  return;
}

Assistant:

static void checkProgress(IntegrityCk *pCheck){
  sqlite3 *db = pCheck->db;
  if( AtomicLoad(&db->u1.isInterrupted) ){
    pCheck->rc = SQLITE_INTERRUPT;
    pCheck->nErr++;
    pCheck->mxErr = 0;
  }
#ifndef SQLITE_OMIT_PROGRESS_CALLBACK
  if( db->xProgress ){
    assert( db->nProgressOps>0 );
    pCheck->nStep++;
    if( (pCheck->nStep % db->nProgressOps)==0
     && db->xProgress(db->pProgressArg)
    ){
      pCheck->rc = SQLITE_INTERRUPT;
      pCheck->nErr++;
      pCheck->mxErr = 0;
    }
  }
#endif
}